

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslator.cpp
# Opt level: O0

void __thiscall BytecodeTranslator::translate(BytecodeTranslator *this,ifstream *i,ofstream *o)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  mapped_type_conflict *pmVar8;
  unsigned_long uVar9;
  size_type sVar10;
  float *pfVar11;
  float local_1f0;
  int local_1ec;
  float f;
  int i_1;
  uint varID_2;
  uint varID_1;
  uint varID2;
  uint varID1;
  uint labelID;
  float val;
  uint varID;
  uint8_t opcode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens_1;
  pointer_to_unary_function<int,_int> local_1a8;
  pointer_to_unary_function<int,_int> local_1a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined8 local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined8 local_170;
  string local_168 [8];
  string s_1;
  undefined1 local_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  pointer_to_unary_function<int,_int> local_120;
  pointer_to_unary_function<int,_int> local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined8 local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined8 local_e8;
  string local_e0 [8];
  string s;
  mapped_type_conflict local_c0;
  mapped_type_conflict local_bc;
  uint curOp;
  uint varOffset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  labels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  vars;
  allocator local_41;
  string local_40 [8];
  string comment;
  ofstream *o_local;
  ifstream *i_local;
  BytecodeTranslator *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"//",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&labels._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&curOp);
  local_bc = 0;
  local_c0 = 0;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_e0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)i,local_e0);
    local_f0._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_e8,&local_f0);
    local_108._M_current = (char *)std::__cxx11::string::begin();
    local_110._M_current = (char *)std::__cxx11::string::end();
    local_120 = std::ptr_fun<int,int>(isspace);
    local_118._M_ptr =
         (_func_int_int *)std::not1<std::pointer_to_unary_function<int,int>>(&local_120);
    local_100 = std::
                find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                          (local_108,local_110,
                           (unary_negate<std::pointer_to_unary_function<int,_int>_>)local_118._M_ptr
                          );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_f8,&local_100);
    std::__cxx11::string::erase(local_e0,local_e8,local_f8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar5 = (string *)std::__cxx11::string::size();
      iVar3 = std::__cxx11::string::compare((ulong)local_e0,0,psVar5);
      if (iVar3 == 0) goto LAB_00104e9e;
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148,(string *)local_e0);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_148,0);
      bVar2 = std::operator==(pvVar6,"var");
      if (bVar2) {
        tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_148,0);
        bVar2 = std::operator==(pvVar6,"label");
        if (bVar2) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_148,1);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&curOp,pvVar6);
          *pmVar8 = local_c0;
          tokens.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
        }
        else {
          local_c0 = local_c0 + 1;
          tokens.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
    }
    else {
LAB_00104e9e:
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    std::__cxx11::string::~string(local_e0);
  }
  std::ios::clear(i + *(long *)(*(long *)i + -0x18),0);
  std::istream::seekg((long)i,_S_beg);
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&curOp);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&labels._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_40);
      return;
    }
    std::__cxx11::string::string(local_168);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)i,local_168);
    local_178._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_170,&local_178);
    local_190._M_current = (char *)std::__cxx11::string::begin();
    local_198._M_current = (char *)std::__cxx11::string::end();
    local_1a8 = std::ptr_fun<int,int>(isspace);
    local_1a0._M_ptr =
         (_func_int_int *)std::not1<std::pointer_to_unary_function<int,int>>(&local_1a8);
    local_188 = std::
                find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                          (local_190,local_198,
                           (unary_negate<std::pointer_to_unary_function<int,_int>_>)local_1a0._M_ptr
                          );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_180,&local_188);
    tokens_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__cxx11::string::erase(local_168,local_170,local_180);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar5 = (string *)std::__cxx11::string::size();
      iVar3 = std::__cxx11::string::compare((ulong)local_168,0,psVar5);
      if (iVar3 == 0) goto LAB_0010520c;
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&varID,(string *)local_168);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&varID,0);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                             *)op::ops_abi_cxx11_,pvVar6);
      val._3_1_ = *pmVar7;
      if (val._3_1_ == op::ASSIGN) {
        std::ostream::write((char *)o,(long)&val + 3);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&varID,1);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)&labels._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar6);
        labelID = *pmVar8;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&varID,2);
        varID1 = (uint)std::__cxx11::stof(pvVar6,(size_t *)0x0);
        std::ostream::write((char *)o,(long)&labelID);
        std::ostream::write((char *)o,(long)&varID1);
      }
      else if (val._3_1_ != op::LABEL) {
        if (val._3_1_ == op::GOTO) {
          std::ostream::write((char *)o,(long)&val + 3);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&varID,1);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&curOp,pvVar6);
          varID2 = *pmVar8;
          std::ostream::write((char *)o,(long)&varID2);
        }
        else if (val._3_1_ == op::MOV) {
          std::ostream::write((char *)o,(long)&val + 3);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&varID,1);
          uVar9 = std::__cxx11::stoul(pvVar6,(size_t *)0x0,10);
          varID_1 = (uint)uVar9;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&varID,2);
          uVar9 = std::__cxx11::stoul(pvVar6,(size_t *)0x0,10);
          varID_2 = (uint)uVar9;
          std::ostream::write((char *)o,(long)&varID_1);
          std::ostream::write((char *)o,(long)&varID_2);
        }
        else if (val._3_1_ == op::VAR) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&varID,1);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&labels._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar6);
          *pmVar8 = local_bc;
          local_bc = local_bc + 4;
        }
        else if (val._3_1_ == op::PUSH) {
          std::ostream::write((char *)o,(long)&val + 3);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&varID,1);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&labels._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar6);
          i_1 = *pmVar8;
          std::ostream::write((char *)o,(long)&i_1);
        }
        else if (val._3_1_ == op::POP) {
          std::ostream::write((char *)o,(long)&val + 3);
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&varID);
          if (1 < sVar10) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&varID,1);
            pfVar11 = (float *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                             *)&labels._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count,pvVar6);
            f = *pfVar11;
            std::ostream::write((char *)o,(long)&f);
          }
        }
        else {
          std::ostream::write((char *)o,(long)&val + 3);
          for (local_1ec = 1; uVar4 = (ulong)local_1ec,
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&varID), uVar4 < sVar10; local_1ec = local_1ec + 1) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&varID,(long)local_1ec);
            local_1f0 = std::__cxx11::stof(pvVar6,(size_t *)0x0);
            std::ostream::write((char *)o,(long)&local_1f0);
          }
        }
      }
      if ((val._3_1_ != op::VAR) && (val._3_1_ != op::LABEL)) {
        std::ostream::write((char *)o,0x10e218);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&varID);
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
LAB_0010520c:
      tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
    }
    std::__cxx11::string::~string(local_168);
  } while( true );
}

Assistant:

void BytecodeTranslator::translate(std::ifstream &i, std::ofstream &o) {
#ifdef PRINT_BYTECODE
    std::stringstream ss;
#endif

    std::string comment("//");
    std::map<std::string, unsigned int> vars;
    std::map<std::string, unsigned int> labels;
    unsigned int varOffset = 0;

    unsigned int curOp = 0;
    //read all labels
    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;

        std::vector<std::string> tokens = split(s);

        if (tokens[0] == "var")
            continue;
        if (tokens[0] == "label") {
#ifdef BT_DEBUG
            printf("read label %s to OP#%i\n", tokens[1].c_str(), curOp);
#endif
            labels[tokens[1]] = curOp;
            continue;
        }
        curOp++;
    }
    i.clear();
    i.seekg(0, std::ios::beg);

    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;
        std::vector<std::string> tokens = split(s);
        uint8_t opcode = op::ops[tokens[0]];

        if (opcode == op::ASSIGN) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            float val = std::stof(tokens[2]);
            o.write((char *) &varID, 4);
            o.write((char *) &val, 4);

#ifdef BT_DEBUG
            printf("assign %f -> $%i\n", val, varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::LABEL) {
            //skip
/*            o.write((char *) &opcode, 1);
            o.write((char *) &labels[tokens[1]], 4);
            printf("writing label %i\n", labels[tokens[1]]);*/
        } else if (opcode == op::GOTO) {
            o.write((char *) &opcode, 1);
            unsigned int labelID = labels[tokens[1]];
            o.write((char *) &labelID, 4);

#ifdef BT_DEBUG
            printf("writing goto %i\n", labelID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(labelID);
#endif
        } else if (opcode == op::MOV) {
            o.write((char *) &opcode, 1);
            unsigned int varID1 = (unsigned int) std::stoul(tokens[1]),
                    varID2 = (unsigned int) std::stoul(tokens[2]);
            o.write((char *) &varID1, 4);
            o.write((char *) &varID2, 4);

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID1) << ' ';
            ss << std::to_string(varID2);
#endif
        } else if (opcode == op::VAR) {
            vars[tokens[1]] = varOffset;
            varOffset += 4;
        } else if (opcode == op::PUSH) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            o.write((char *) &varID, 4);

#ifdef BT_DEBUG
            printf("writing push -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::POP) {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            if (tokens.size() > 1) {
                unsigned int varID = vars[tokens[1]];
                o.write((char *) &varID, 4);

#ifdef BT_DEBUG
                printf("writing pop -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
                ss << std::to_string(varID);
#endif
            }
#ifdef BT_DEBUG
            else printf("writing pop\n");
#endif
        } else {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            for (int i = 1; i < tokens.size(); i++) {
                float f = std::stof(tokens[i]);
#ifdef PRINT_BYTECODE
                ss << std::to_string(f) << ' ';
#endif
                o.write((char *) &f, 4);
            }
        }
        if (opcode != op::VAR && opcode != op::LABEL) {
#ifdef PRINT_BYTECODE
            ss << '\n';
#endif
            o.write(&lineSeparator, 1);
        }
    }

#ifdef PRINT_BYTECODE
    std::cout << "SS:" << '\n';
    std::cout << ss.str() << '\n';
#endif
}